

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_parsedoffset.cc
# Opt level: O3

void walk(size_t stream_number,QPDFObjectHandle *obj,
         vector<std::vector<std::pair<long_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<long_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::vector<std::pair<long_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<long_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
         *result)

{
  char cVar1;
  pointer pvVar2;
  undefined8 uVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  QPDFObjectHandle item;
  pair<long_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  p;
  undefined1 local_d8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8 [2];
  QPDFObjectHandle local_a8;
  element_type *local_98;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_90;
  QPDFObjectHandle local_88;
  QPDFObjectHandle local_78;
  value_type local_68;
  QPDFObjectHandle local_40;
  
  local_68.first = QPDFObjectHandle::getParsedOffset();
  local_78.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (obj->super_BaseHandle).obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ;
  local_78.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi =
       (obj->super_BaseHandle).obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  if (local_78.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)(local_78.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi + 8) =
           *(int *)(local_78.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi + 8
                   ) + 1;
      UNLOCK();
    }
    else {
      *(int *)(local_78.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi + 8) =
           *(int *)(local_78.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi + 8
                   ) + 1;
    }
  }
  make_objdesc_abi_cxx11_((string *)local_d8,local_68.first,&local_78);
  local_68.second._M_dataplus._M_p = (pointer)&local_68.second.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._0_8_ == local_c8) {
    local_68.second.field_2._8_8_ = local_c8[0]._8_8_;
  }
  else {
    local_68.second._M_dataplus._M_p = (pointer)local_d8._0_8_;
  }
  local_68.second.field_2._M_allocated_capacity._1_7_ = local_c8[0]._M_allocated_capacity._1_7_;
  local_68.second.field_2._M_local_buf[0] = local_c8[0]._M_local_buf[0];
  local_68.second._M_string_length = local_d8._8_8_;
  local_d8._8_8_ =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)0x0;
  local_c8[0]._M_local_buf[0] = '\0';
  local_d8._0_8_ = local_c8;
  if (local_78.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  pvVar2 = (result->
           super__Vector_base<std::vector<std::pair<long_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<long_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::vector<std::pair<long_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<long_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)(((long)(result->
                     super__Vector_base<std::vector<std::pair<long_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<long_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::vector<std::pair<long_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<long_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar2 >> 3) *
             -0x5555555555555555) < stream_number + 1) {
    std::
    vector<std::vector<std::pair<long_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<long_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::vector<std::pair<long_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<long_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
    ::resize(result,stream_number + 1);
    pvVar2 = (result->
             super__Vector_base<std::vector<std::pair<long_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<long_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::vector<std::pair<long_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<long_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
  }
  std::
  vector<std::pair<long_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<long_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::push_back(pvVar2 + stream_number,&local_68);
  cVar1 = QPDFObjectHandle::isArray();
  if (cVar1 == '\0') {
    cVar1 = QPDFObjectHandle::isDictionary();
    if (cVar1 == '\0') {
      cVar1 = QPDFObjectHandle::isStream();
      if (cVar1 != '\0') {
        QPDFObjectHandle::getDict();
        walk(stream_number,&local_40,result);
        if (local_40.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_40.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
        }
      }
    }
    else {
      QPDFObjectHandle::getKeys_abi_cxx11_();
      if ((_Rb_tree_node_base *)local_c8[0]._8_8_ != (_Rb_tree_node_base *)(local_d8 + 8)) {
        uVar3 = local_c8[0]._8_8_;
        do {
          QPDFObjectHandle::getKey((string *)&local_98);
          cVar1 = QPDFObjectHandle::isIndirect();
          if (cVar1 == '\0') {
            local_a8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr = local_98;
            local_a8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi = local_90;
            if (local_90 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                *(int *)(local_90 + 8) = *(int *)(local_90 + 8) + 1;
                UNLOCK();
              }
              else {
                *(int *)(local_90 + 8) = *(int *)(local_90 + 8) + 1;
              }
            }
            walk(stream_number,&local_a8,result);
            if (local_a8.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_a8.super_BaseHandle.obj.
                         super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                         _M_pi);
            }
          }
          if (local_90 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_90);
          }
          uVar3 = std::_Rb_tree_increment((_Rb_tree_node_base *)uVar3);
        } while ((_Rb_tree_node_base *)uVar3 != (_Rb_tree_node_base *)(local_d8 + 8));
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_d8);
    }
  }
  else {
    QPDFObjectHandle::getArrayAsVector();
    uVar3 = local_d8._8_8_;
    if (local_d8._0_8_ != local_d8._8_8_) {
      paVar4 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_d8._0_8_;
      do {
        cVar1 = QPDFObjectHandle::isIndirect();
        if (cVar1 == '\0') {
          local_88.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr = (element_type *)paVar4->_M_allocated_capacity;
          local_88.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi =
               *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(paVar4->_M_local_buf + 8);
          if (local_88.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              *(int *)(local_88.super_BaseHandle.obj.
                       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                      + 8) = *(int *)(local_88.super_BaseHandle.obj.
                                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                      _M_refcount._M_pi + 8) + 1;
              UNLOCK();
            }
            else {
              *(int *)(local_88.super_BaseHandle.obj.
                       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                      + 8) = *(int *)(local_88.super_BaseHandle.obj.
                                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                      _M_refcount._M_pi + 8) + 1;
            }
          }
          walk(stream_number,&local_88,result);
          if (local_88.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_88.super_BaseHandle.obj.
                       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
            ;
          }
        }
        paVar4 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(paVar4->_M_local_buf + 0x10);
      } while (paVar4 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)uVar3);
    }
    std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::~vector
              ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)local_d8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68.second._M_dataplus._M_p != &local_68.second.field_2) {
    operator_delete(local_68.second._M_dataplus._M_p,
                    local_68.second.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void
walk(
    size_t stream_number,
    QPDFObjectHandle obj,
    std::vector<std::vector<std::pair<qpdf_offset_t, std::string>>>& result)
{
    qpdf_offset_t offset = obj.getParsedOffset();
    std::pair<qpdf_offset_t, std::string> p = std::make_pair(offset, make_objdesc(offset, obj));

    if (result.size() < stream_number + 1) {
        result.resize(stream_number + 1);
    }
    result[stream_number].push_back(p);

    if (obj.isArray()) {
        for (auto& oh: obj.getArrayAsVector()) {
            if (!oh.isIndirect()) {
                // QPDF::GetAllObjects() enumerates all indirect objects.
                // So only the direct objects are recursed here.
                walk(stream_number, oh, result);
            }
        }
    } else if (obj.isDictionary()) {
        for (auto const& key: obj.getKeys()) {
            QPDFObjectHandle item = obj.getKey(key);
            if (!item.isIndirect()) {
                // QPDF::GetAllObjects() enumerates all indirect objects.
                // So only the direct objects are recursed here.
                walk(stream_number, item, result);
            }
        }
    } else if (obj.isStream()) {
        walk(stream_number, obj.getDict(), result);
    }
}